

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_certificate_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::ParsedCertificateTest_IssuerBadPrintableString_Test::TestBody
          (ParsedCertificateTest_IssuerBadPrintableString_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_a0;
  AssertHelper local_80;
  Message local_78;
  ParseCertificateOptions local_6d [20];
  allocator<char> local_59;
  string local_58;
  shared_ptr<const_bssl::ParsedCertificate> local_38;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  ParsedCertificateTest_IssuerBadPrintableString_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"issuer_bad_printable_string.pem",&local_59);
  local_6d[0].allow_invalid_serial_numbers = false;
  ParseCertificateFromFile((anon_unknown_0 *)&local_38,&local_58,local_6d);
  local_21 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
  local_21 = !local_21;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_a0,(internal *)local_20,
               (AssertionResult *)
               "ParseCertificateFromFile(\"issuer_bad_printable_string.pem\", {})","true","false",
               in_R9);
    message = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parsed_certificate_unittest.cc"
               ,0xb9,message);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(ParsedCertificateTest, IssuerBadPrintableString) {
  ASSERT_FALSE(ParseCertificateFromFile("issuer_bad_printable_string.pem", {}));
}